

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_compile_commands.cxx
# Opt level: O3

void __thiscall CompileCommandParser::ParseTranslationUnits(CompileCommandParser *this)

{
  pointer pCVar1;
  char cVar2;
  undefined1 local_68 [32];
  vector<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>
  local_48;
  
  local_68._16_8_ =
       (this->TranslationUnits).
       super__Vector_base<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68._0_8_ =
       (this->TranslationUnits).
       super__Vector_base<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_68._8_8_ =
       (this->TranslationUnits).
       super__Vector_base<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->TranslationUnits).
  super__Vector_base<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->TranslationUnits).
  super__Vector_base<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->TranslationUnits).
  super__Vector_base<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.
  super__Vector_base<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>
  ::~vector((vector<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>
             *)local_68);
  std::vector<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>
  ::~vector(&local_48);
  pCVar1 = (pointer)(local_68 + 0x10);
  local_68._0_8_ = pCVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"at start of compile command file\n","");
  ExpectOrDie(this,'[',(string *)local_68);
  if ((pointer)local_68._0_8_ != pCVar1) {
    operator_delete((void *)local_68._0_8_,(ulong)(local_68._16_8_ + 1));
  }
  ParseTranslationUnit(this);
  std::vector<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>
  ::push_back(&this->TranslationUnits,&this->Command);
  cVar2 = this->C;
  do {
    if (cVar2 != ',') {
      local_68._0_8_ = pCVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"at end of array","");
      ExpectOrDie(this,']',(string *)local_68);
      if ((pointer)local_68._0_8_ != pCVar1) {
        operator_delete((void *)local_68._0_8_,(ulong)(local_68._16_8_ + 1));
      }
      return;
    }
    do {
      Next(this);
      if (0x20 < (ulong)(byte)this->C) break;
    } while ((0x100002600U >> ((ulong)(byte)this->C & 0x3f) & 1) != 0);
    ParseTranslationUnit(this);
    std::
    vector<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>::
    push_back(&this->TranslationUnits,&this->Command);
    cVar2 = this->C;
  } while( true );
}

Assistant:

void ParseTranslationUnits()
  {
    this->TranslationUnits = TranslationUnitsType();
    ExpectOrDie('[', "at start of compile command file\n");
    do
      {
      ParseTranslationUnit();
      this->TranslationUnits.push_back(this->Command);
      } while(Expect(','));
    ExpectOrDie(']', "at end of array");
  }